

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

void Diligent::AppendShaderSourceCode(string *Source,ShaderCreateInfo *ShaderCI)

{
  Char *Message;
  char (*in_RCX) [29];
  undefined1 local_60 [8];
  ShaderSourceFileData SourceData;
  undefined1 local_38 [8];
  string msg;
  ShaderCreateInfo *ShaderCI_local;
  string *Source_local;
  
  msg.field_2._8_8_ = ShaderCI;
  if (ShaderCI->ByteCode != (void *)0x0) {
    FormatString<char[26],char[29]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderCI.ByteCode == nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AppendShaderSourceCode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
               ,0x116);
    std::__cxx11::string::~string((string *)local_38);
  }
  ReadShaderSourceFile((ShaderSourceFileData *)local_60,(ShaderCreateInfo *)msg.field_2._8_8_);
  std::__cxx11::string::append((char *)Source,(ulong)SourceData.pFileData.m_pObject);
  ShaderSourceFileData::~ShaderSourceFileData((ShaderSourceFileData *)local_60);
  return;
}

Assistant:

void AppendShaderSourceCode(std::string& Source, const ShaderCreateInfo& ShaderCI) noexcept(false)
{
    VERIFY_EXPR(ShaderCI.ByteCode == nullptr);
    const auto SourceData = ReadShaderSourceFile(ShaderCI);
    Source.append(SourceData.Source, SourceData.SourceLength);
}